

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFrames.c
# Opt level: O0

Aig_Man_t *
Aig_ManFrames(Aig_Man_t *pAig,int nFs,int fInit,int fOuts,int fRegs,int fEnlarge,
             Aig_Obj_t ***ppObjMap)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t **pObjMap_00;
  Aig_Man_t *p;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int local_174;
  int local_12c;
  int local_60;
  int local_5c;
  int f;
  int i;
  Aig_Obj_t **pObjMap;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pFrames;
  int fEnlarge_local;
  int fRegs_local;
  int fOuts_local;
  int fInit_local;
  int nFs_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ManObjNumMax(pAig);
  pObjMap_00 = (Aig_Obj_t **)malloc((long)(nFs * iVar1) << 3);
  iVar1 = Aig_ManObjNumMax(pAig);
  memset(pObjMap_00,0,(long)nFs * 8 * (long)iVar1);
  iVar1 = Aig_ManObjNumMax(pAig);
  p = Aig_ManStart(iVar1 * nFs);
  pcVar3 = Abc_UtilStrsav(pAig->pName);
  p->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pAig->pSpec);
  p->pSpec = pcVar3;
  for (local_60 = 0; local_60 < nFs; local_60 = local_60 + 1) {
    pAVar4 = Aig_ManConst1(pAig);
    pAVar5 = Aig_ManConst1(p);
    Aig_ObjSetFrames(pObjMap_00,nFs,pAVar4,local_60,pAVar5);
  }
  for (local_60 = 0; local_60 < nFs; local_60 = local_60 + 1) {
    local_5c = 0;
    while( true ) {
      iVar1 = Aig_ManCiNum(pAig);
      iVar2 = Aig_ManRegNum(pAig);
      if (iVar1 - iVar2 <= local_5c) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_5c);
      pAVar5 = Aig_ObjCreateCi(p);
      Aig_ObjSetFrames(pObjMap_00,nFs,pAVar4,local_60,pAVar5);
      local_5c = local_5c + 1;
    }
  }
  if (fInit == 0) {
    local_5c = Aig_ManCiNum(pAig);
    iVar1 = Aig_ManRegNum(pAig);
    for (local_5c = local_5c - iVar1; iVar1 = Vec_PtrSize(pAig->vCis), local_5c < iVar1;
        local_5c = local_5c + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_5c);
      pAVar5 = Aig_ObjCreateCi(p);
      Aig_ObjSetFrames(pObjMap_00,nFs,pAVar4,0,pAVar5);
    }
  }
  else {
    local_5c = Aig_ManCiNum(pAig);
    iVar1 = Aig_ManRegNum(pAig);
    for (local_5c = local_5c - iVar1; iVar1 = Vec_PtrSize(pAig->vCis), local_5c < iVar1;
        local_5c = local_5c + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_5c);
      pAVar5 = Aig_ManConst0(p);
      Aig_ObjSetFrames(pObjMap_00,nFs,pAVar4,0,pAVar5);
    }
  }
  for (local_60 = 0; local_60 < nFs; local_60 = local_60 + 1) {
    for (local_5c = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_5c < iVar1; local_5c = local_5c + 1)
    {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_5c);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        pAVar5 = Aig_ObjChild0Frames(pObjMap_00,nFs,pAVar4,local_60);
        p1 = Aig_ObjChild1Frames(pObjMap_00,nFs,pAVar4,local_60);
        pAVar5 = Aig_And(p,pAVar5,p1);
        Aig_ObjSetFrames(pObjMap_00,nFs,pAVar4,local_60,pAVar5);
      }
    }
    for (local_5c = 0; iVar1 = Aig_ManRegNum(pAig), local_5c < iVar1; local_5c = local_5c + 1) {
      pAVar4 = Aig_ManLi(pAig,local_5c);
      pAVar5 = Aig_ManLo(pAig,local_5c);
      pAVar4 = Aig_ObjChild0Frames(pObjMap_00,nFs,pAVar4,local_60);
      if (local_60 < nFs + -1) {
        Aig_ObjSetFrames(pObjMap_00,nFs,pAVar5,local_60 + 1,pAVar4);
      }
    }
  }
  if (fOuts != 0) {
    if (fEnlarge == 0) {
      local_12c = 0;
    }
    else {
      local_12c = nFs + -1;
    }
    for (local_60 = local_12c; local_60 < nFs; local_60 = local_60 + 1) {
      local_5c = 0;
      while( true ) {
        iVar1 = Aig_ManCoNum(pAig);
        iVar2 = Aig_ManRegNum(pAig);
        if (iVar1 - iVar2 <= local_5c) break;
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_5c);
        pAVar5 = Aig_ObjChild0Frames(pObjMap_00,nFs,pAVar4,local_60);
        pAVar5 = Aig_ObjCreateCo(p,pAVar5);
        Aig_ObjSetFrames(pObjMap_00,nFs,pAVar4,local_60,pAVar5);
        local_5c = local_5c + 1;
      }
    }
  }
  if (fRegs != 0) {
    p->nRegs = pAig->nRegs;
    local_5c = Aig_ManCoNum(pAig);
    iVar1 = Aig_ManRegNum(pAig);
    for (local_5c = local_5c - iVar1; iVar1 = Vec_PtrSize(pAig->vCos), local_5c < iVar1;
        local_5c = local_5c + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_5c);
      if (fEnlarge == 0) {
        local_174 = nFs + -1;
      }
      else {
        local_174 = 0;
      }
      pAVar5 = Aig_ObjChild0Frames(pObjMap_00,nFs,pAVar4,local_174);
      pAVar5 = Aig_ObjCreateCo(p,pAVar5);
      Aig_ObjSetFrames(pObjMap_00,nFs,pAVar4,nFs + -1,pAVar5);
    }
    iVar1 = Aig_ManRegNum(pAig);
    Aig_ManSetRegNum(p,iVar1);
  }
  Aig_ManCleanup(p);
  if (ppObjMap == (Aig_Obj_t ***)0x0) {
    if (pObjMap_00 != (Aig_Obj_t **)0x0) {
      free(pObjMap_00);
    }
  }
  else {
    *ppObjMap = pObjMap_00;
  }
  return p;
}

Assistant:

Aig_Man_t * Aig_ManFrames( Aig_Man_t * pAig, int nFs, int fInit, int fOuts, int fRegs, int fEnlarge, Aig_Obj_t *** ppObjMap )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f;

    // create mapping for the frames nodes
    pObjMap  = ABC_ALLOC( Aig_Obj_t *, nFs * Aig_ManObjNumMax(pAig) );
    memset( pObjMap, 0, sizeof(Aig_Obj_t *) * nFs * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFs );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFs; f++ )
        Aig_ObjSetFrames( pObjMap, nFs, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFs; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    if ( fInit )
    {
        Aig_ManForEachLoSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, 0, Aig_ManConst0(pFrames) );
    }
    else 
    {
        Aig_ManForEachLoSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFs, pObj, 0, Aig_ObjCreateCi(pFrames) );
    }

    // add timeframes
    for ( f = 0; f < nFs; f++ )
    {
//        printf( "Frame = %d.\n", f );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
        {
//            Aig_Obj_t * pFanin0 = Aig_ObjChild0Frames(pObjMap,nFs,pObj,f);
//            Aig_Obj_t * pFanin1 = Aig_ObjChild1Frames(pObjMap,nFs,pObj,f);
//            printf( "Node = %3d.  Fanin0 = %3d. Fanin1 = %3d.\n", pObj->Id, Aig_Regular(pFanin0)->Id, Aig_Regular(pFanin1)->Id );
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,f), Aig_ObjChild1Frames(pObjMap,nFs,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFs, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFs,pObjLi,f);
            if ( f < nFs - 1 )
                Aig_ObjSetFrames( pObjMap, nFs, pObjLo, f+1, pObjNew );
        }
    }
    if ( fOuts )
    {
        for ( f = fEnlarge?nFs-1:0; f < nFs; f++ )
            Aig_ManForEachPoSeq( pAig, pObj, i )
            {
                pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,f) );
                Aig_ObjSetFrames( pObjMap, nFs, pObj, f, pObjNew );
            }
    }
    if ( fRegs )
    {
        pFrames->nRegs = pAig->nRegs;
        Aig_ManForEachLiSeq( pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCo( pFrames, Aig_ObjChild0Frames(pObjMap,nFs,pObj,fEnlarge?0:nFs-1) );
            Aig_ObjSetFrames( pObjMap, nFs, pObj, nFs-1, pObjNew );
        }
        Aig_ManSetRegNum( pFrames, Aig_ManRegNum(pAig) );
    }
    Aig_ManCleanup( pFrames );
    // return the new manager
    if ( ppObjMap )
        *ppObjMap = pObjMap;
    else
        ABC_FREE( pObjMap );
    return pFrames;
}